

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void chaiscript::Module::
     apply_eval<chaiscript::ChaiScript_Basic,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      end,ChaiScript_Basic *t)

{
  ChaiScript_Basic *t_input;
  bool bVar1;
  reference t_handler;
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [32];
  ChaiScript_Basic *local_20;
  ChaiScript_Basic *t_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin_local;
  
  local_20 = t;
  t_local = (ChaiScript_Basic *)end._M_current;
  end_local._M_current = begin._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      (&end_local,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&t_local);
    t_input = local_20;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    t_handler = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&end_local);
    std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::shared_ptr
              ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_60,"__EVAL__",&local_61);
    ChaiScript_Basic::eval
              ((ChaiScript_Basic *)(local_40 + 0x10),(string *)t_input,
               (Exception_Handler *)t_handler,(string *)local_40);
    Boxed_Value::~Boxed_Value((Boxed_Value *)(local_40 + 0x10));
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    std::shared_ptr<chaiscript::detail::Exception_Handler_Base>::~shared_ptr
              ((shared_ptr<chaiscript::detail::Exception_Handler_Base> *)local_40);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&end_local);
  }
  return;
}

Assistant:

static void apply_eval(InItr begin, InItr end, T &t) {
      while (begin != end) {
        t.eval(*begin);
        ++begin;
      }
    }